

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O2

void __thiscall StackTrace::pop_stack_element(StackTrace *this)

{
  ipc::spinlock::lock(&this->lock);
  this->_ce = **(vertex_descriptor **)
                &(this->_local_stack).super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->_ce].super_StoredVertex.m_out_edges
                 .
                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ;
  (this->lock)._locked._M_base._M_i = false;
  return;
}

Assistant:

void StackTrace::pop_stack_element() {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto edge = boost::out_edges(_ce, _local_stack);
  _ce = (boost::target(*(edge.first), _local_stack));

#if 0
    _pop_count++;
    if(_pop_count > 1000){ // TODO: magic value?
        _pop_count = 0;
        // clean has a huge performance impact
        clean();
    }
#endif
}